

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O2

bool __thiscall
sptk::StatisticsAccumulation::Run
          (StatisticsAccumulation *this,vector<double,_std::allocator<double>_> *data,Buffer *buffer
          )

{
  double dVar1;
  pointer pdVar2;
  double *pdVar3;
  int iVar4;
  double *pdVar5;
  double *pdVar6;
  bool bVar7;
  size_type __new_size;
  ulong uVar8;
  int i;
  ulong uVar9;
  double dVar10;
  Row local_50;
  double local_38;
  
  if (this->is_valid_ == true) {
    bVar7 = false;
    if ((buffer != (Buffer *)0x0) &&
       (__new_size = (long)this->num_order_ + 1, bVar7 = false,
       (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == __new_size)) {
      iVar4 = this->num_statistics_order_;
      if (0 < iVar4) {
        if ((long)(buffer->first_order_statistics_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(buffer->first_order_statistics_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3 != __new_size) {
          std::vector<double,_std::allocator<double>_>::resize
                    (&buffer->first_order_statistics_,__new_size);
          iVar4 = this->num_statistics_order_;
        }
        if ((1 < iVar4) && ((buffer->second_order_statistics_).num_dimension_ != (int)__new_size)) {
          SymmetricMatrix::Resize(&buffer->second_order_statistics_,(int)__new_size);
        }
      }
      if ((this->numerically_stable_ == true) &&
         ((long)(buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size)) {
        std::vector<double,_std::allocator<double>_>::resize(&buffer->delta_,__new_size);
      }
      buffer->zeroth_order_statistics_ = buffer->zeroth_order_statistics_ + 1;
      iVar4 = this->num_statistics_order_;
      bVar7 = true;
      if (0 < iVar4) {
        if (this->numerically_stable_ == true) {
          std::
          transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::minus<double>>
                    ((data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish,
                     (buffer->first_order_statistics_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
          iVar4 = this->num_statistics_order_;
        }
        if (1 < iVar4) {
          if (this->numerically_stable_ == false) {
            for (uVar9 = 0; (long)uVar9 <= (long)this->num_order_; uVar9 = uVar9 + 1) {
              uVar8 = uVar9 & 0xffffffff;
              if (this->diagonal_ == false) {
                uVar8 = 0;
              }
              for (; uVar8 <= uVar9; uVar8 = uVar8 + 1) {
                pdVar2 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                dVar1 = pdVar2[uVar9];
                dVar10 = pdVar2[uVar8];
                local_50._vptr_Row = (_func_int **)&PTR__Row_00110d30;
                local_50.matrix_ = &buffer->second_order_statistics_;
                local_50.row_ = (int)uVar9;
                pdVar5 = SymmetricMatrix::Row::operator[](&local_50,(int)uVar8);
                *pdVar5 = dVar1 * dVar10 + *pdVar5;
              }
            }
          }
          else {
            pdVar2 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_38 = ((double)buffer->zeroth_order_statistics_ + -1.0) /
                       (double)buffer->zeroth_order_statistics_;
            for (uVar9 = 0; (long)uVar9 <= (long)this->num_order_; uVar9 = uVar9 + 1) {
              uVar8 = uVar9 & 0xffffffff;
              if (this->diagonal_ == false) {
                uVar8 = 0;
              }
              for (; uVar8 <= uVar9; uVar8 = uVar8 + 1) {
                dVar10 = pdVar2[uVar9] * local_38;
                dVar1 = pdVar2[uVar8];
                local_50._vptr_Row = (_func_int **)&PTR__Row_00110d30;
                local_50.matrix_ = &buffer->second_order_statistics_;
                local_50.row_ = (int)uVar9;
                pdVar5 = SymmetricMatrix::Row::operator[](&local_50,(int)uVar8);
                *pdVar5 = dVar10 * dVar1 + *pdVar5;
              }
            }
          }
        }
        if (this->num_statistics_order_ < 1) {
          bVar7 = true;
        }
        else {
          bVar7 = true;
          if (this->numerically_stable_ == true) {
            iVar4 = buffer->zeroth_order_statistics_;
            pdVar5 = (buffer->first_order_statistics_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar3 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (pdVar6 = (buffer->delta_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start; pdVar6 != pdVar3;
                pdVar6 = pdVar6 + 1) {
              *pdVar5 = *pdVar6 * (1.0 / (double)iVar4) + *pdVar5;
              pdVar5 = pdVar5 + 1;
            }
          }
          else {
            std::
            transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::plus<double>>
                      ((data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start,
                       (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish,
                       (buffer->first_order_statistics_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
          }
        }
      }
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool StatisticsAccumulation::Run(const std::vector<double>& data,
                                 StatisticsAccumulation::Buffer* buffer) const {
  // Check inputs.
  const std::size_t length(num_order_ + 1);
  if (!is_valid_ || data.size() != length || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (1 <= num_statistics_order_ &&
      buffer->first_order_statistics_.size() != length) {
    buffer->first_order_statistics_.resize(length);
  }
  if (2 <= num_statistics_order_ &&
      buffer->second_order_statistics_.GetNumDimension() !=
          static_cast<int>(length)) {
    buffer->second_order_statistics_.Resize(static_cast<int>(length));
  }
  if (numerically_stable_ && buffer->delta_.size() != length) {
    buffer->delta_.resize(length);
  }

  // Accumulate 0th order statistics.
  ++(buffer->zeroth_order_statistics_);

  // Compute delta.
  if (1 <= num_statistics_order_ && numerically_stable_) {
    std::transform(data.begin(), data.end(),
                   buffer->first_order_statistics_.begin(),
                   buffer->delta_.begin(), std::minus<double>());
  }
  const double* delta(&(buffer->delta_[0]));

  // Accumulate 2nd order statistics.
  if (2 <= num_statistics_order_) {
    if (numerically_stable_) {
      const double n(static_cast<double>(buffer->zeroth_order_statistics_));
      const double z((n - 1) / n);
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          buffer->second_order_statistics_[i][j] += z * delta[i] * delta[j];
        }
      }
    } else {
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          buffer->second_order_statistics_[i][j] += data[i] * data[j];
        }
      }
    }
  }

  // Accumulate 1st order statistics.
  if (1 <= num_statistics_order_) {
    if (numerically_stable_) {
      const double z(1.0 / buffer->zeroth_order_statistics_);
      std::transform(buffer->delta_.begin(), buffer->delta_.end(),
                     buffer->first_order_statistics_.begin(),
                     buffer->first_order_statistics_.begin(),
                     [z](double d, double a) { return a + z * d; });
    } else {
      std::transform(
          data.begin(), data.end(), buffer->first_order_statistics_.begin(),
          buffer->first_order_statistics_.begin(), std::plus<double>());
    }
  }

  return true;
}